

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_lzop.c
# Opt level: O2

int lzop_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  int iVar2;
  ssize_t in_RAX;
  void *__s1;
  ssize_t avail;
  
  avail = in_RAX;
  __s1 = __archive_read_filter_ahead(filter,9,&avail);
  iVar1 = 0;
  if ((__s1 != (void *)0x0) && (avail != 0)) {
    iVar2 = bcmp(__s1,anon_var_dwarf_e84c09,9);
    iVar1 = 0x48;
    if (iVar2 != 0) {
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int
lzop_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *p;
	ssize_t avail;

	(void)self; /* UNUSED */

	p = __archive_read_filter_ahead(filter, LZOP_HEADER_MAGIC_LEN, &avail);
	if (p == NULL || avail == 0)
		return (0);

	if (memcmp(p, LZOP_HEADER_MAGIC, LZOP_HEADER_MAGIC_LEN))
		return (0);

	return (LZOP_HEADER_MAGIC_LEN * 8);
}